

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pmbtoken.cc
# Opt level: O3

int pmbtoken_pst1_hash_s(EC_GROUP *group,EC_JACOBIAN *out,EC_AFFINE *t,uint8_t *s)

{
  int iVar1;
  uint8_t *orig_ptr;
  uint uVar2;
  uint8_t *buf;
  size_t len;
  uint8_t kHashSLabel [23];
  CBB cbb;
  uint8_t *local_88;
  size_t local_80;
  uint8_t local_78 [24];
  CBB local_60;
  
  builtin_memcpy(local_78,"PMBTokens PST V1 HashS",0x17);
  local_88 = (uint8_t *)0x0;
  iVar1 = CBB_init(&local_60,0);
  uVar2 = 0;
  orig_ptr = (uint8_t *)0x0;
  if (iVar1 != 0) {
    iVar1 = point_to_cbb(&local_60,group,t);
    if (iVar1 == 0) {
      orig_ptr = (uint8_t *)0x0;
      uVar2 = 0;
    }
    else {
      iVar1 = CBB_add_bytes(&local_60,s,0x40);
      uVar2 = 0;
      if (iVar1 == 0) {
        orig_ptr = (uint8_t *)0x0;
      }
      else {
        iVar1 = CBB_finish(&local_60,&local_88,&local_80);
        orig_ptr = local_88;
        if (iVar1 != 0) {
          iVar1 = ec_hash_to_curve_p384_xmd_sha384_sswu(group,out,local_78,0x17,local_88,local_80);
          uVar2 = (uint)(iVar1 != 0);
          orig_ptr = local_88;
        }
      }
    }
  }
  OPENSSL_free(orig_ptr);
  CBB_cleanup(&local_60);
  return uVar2;
}

Assistant:

static int pmbtoken_pst1_hash_s(const EC_GROUP *group, EC_JACOBIAN *out,
                                const EC_AFFINE *t,
                                const uint8_t s[TRUST_TOKEN_NONCE_SIZE]) {
  const uint8_t kHashSLabel[] = "PMBTokens PST V1 HashS";
  int ret = 0;
  CBB cbb;
  uint8_t *buf = NULL;
  size_t len;
  if (!CBB_init(&cbb, 0) || !point_to_cbb(&cbb, group, t) ||
      !CBB_add_bytes(&cbb, s, TRUST_TOKEN_NONCE_SIZE) ||
      !CBB_finish(&cbb, &buf, &len) ||
      !ec_hash_to_curve_p384_xmd_sha384_sswu(group, out, kHashSLabel,
                                             sizeof(kHashSLabel), buf, len)) {
    goto err;
  }

  ret = 1;

err:
  OPENSSL_free(buf);
  CBB_cleanup(&cbb);
  return ret;
}